

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int nghttp2_hd_inflate_init(nghttp2_hd_inflater *inflater,nghttp2_mem *mem)

{
  int iVar1;
  
  iVar1 = hd_context_init(&inflater->ctx,mem);
  if (iVar1 == 0) {
    inflater->settings_hd_table_bufsize_max = 0x1000;
    inflater->min_hd_table_bufsize_max = 0xffffffff;
    inflater->opcode = NGHTTP2_HD_OPCODE_NONE;
    inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
    inflater->nv_name_keep = (nghttp2_rcbuf *)0x0;
    inflater->nv_value_keep = (nghttp2_rcbuf *)0x0;
    nghttp2_buf_init(&inflater->namebuf);
    nghttp2_buf_init(&inflater->valuebuf);
    inflater->huffman_encoded = '\0';
    inflater->index_required = '\0';
    inflater->shift = 0;
    inflater->no_index = '\0';
    inflater->namercbuf = (nghttp2_rcbuf *)0x0;
    inflater->valuercbuf = (nghttp2_rcbuf *)0x0;
    inflater->left = 0;
    inflater->index = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_hd_inflate_init(nghttp2_hd_inflater *inflater, nghttp2_mem *mem) {
  int rv;

  rv = hd_context_init(&inflater->ctx, mem);
  if (rv != 0) {
    goto fail;
  }

  inflater->settings_hd_table_bufsize_max = NGHTTP2_HD_DEFAULT_MAX_BUFFER_SIZE;
  inflater->min_hd_table_bufsize_max = UINT32_MAX;

  inflater->nv_name_keep = NULL;
  inflater->nv_value_keep = NULL;

  inflater->opcode = NGHTTP2_HD_OPCODE_NONE;
  inflater->state = NGHTTP2_HD_STATE_INFLATE_START;

  nghttp2_buf_init(&inflater->namebuf);
  nghttp2_buf_init(&inflater->valuebuf);

  inflater->namercbuf = NULL;
  inflater->valuercbuf = NULL;

  inflater->huffman_encoded = 0;
  inflater->index = 0;
  inflater->left = 0;
  inflater->shift = 0;
  inflater->index_required = 0;
  inflater->no_index = 0;

  return 0;

fail:
  return rv;
}